

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

bool __thiscall ON_OutlineFigure::NegateY(ON_OutlineFigure *this)

{
  double dVar1;
  ON_OutlineFigurePoint *pOVar2;
  Orientation OVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)(uint)(this->m_points).m_count;
  pOVar2 = (this->m_points).m_a;
  bVar4 = false;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    bVar6 = Internal_NegateY(&pOVar2->m_point);
    bVar4 = (bool)(bVar4 | bVar6);
    pOVar2 = (ON_OutlineFigurePoint *)(&pOVar2->m_point + 1);
  }
  if (bVar4 == false) {
    return false;
  }
  if (this->m_orientation == Clockwise) {
    OVar3 = CounterClockwise;
  }
  else {
    if (this->m_orientation != CounterClockwise) goto LAB_004ada8c;
    OVar3 = Clockwise;
  }
  this->m_orientation = OVar3;
LAB_004ada8c:
  bVar6 = ON_IsValid(this->m_area_estimate);
  if (bVar6) {
    dVar1 = this->m_area_estimate;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      this->m_area_estimate = -dVar1;
    }
  }
  return bVar4;
}

Assistant:

bool ON_OutlineFigure::NegateY()
{
  bool rc = false;
  const ON__UINT32 count = m_points.UnsignedCount();
  ON_OutlineFigurePoint* a = m_points.Array();
  for (ON__UINT32 i = 0; i < count; i++)
  {
    if ( ON_OutlineFigure::Internal_NegateY(a[i].m_point) )
      rc = true;
  }

  if (rc)
  {
    if (ON_OutlineFigure::Orientation::Clockwise == m_orientation)
      m_orientation = ON_OutlineFigure::Orientation::CounterClockwise;
    else if (ON_OutlineFigure::Orientation::CounterClockwise == m_orientation)
      m_orientation = ON_OutlineFigure::Orientation::Clockwise;

    if (ON_IsValid(m_area_estimate) && 0.0 != m_area_estimate)
      m_area_estimate = -m_area_estimate;
  }

  return rc;
}